

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void PresentScreen(void)

{
  SDL_Renderer *pSVar1;
  SDL_Texture *pSVar2;
  SDL20_RenderCopy_t p_Var3;
  SDL_Renderer *pSVar4;
  SDL_Rect *pSVar5;
  undefined1 local_38 [8];
  SDL_Rect dstrect20;
  SDL12_YUVData *hwdata;
  QueuedOverlayItem *next;
  SDL_Renderer *renderer;
  QueuedOverlayItem *overlay;
  
  pSVar4 = LockVideoRenderer();
  if (pSVar4 != (SDL_Renderer *)0x0) {
    if (EventThreadEnabled != SDL_FALSE) {
      SDL_PumpEvents();
    }
    (*SDL20_RenderClear)(pSVar4);
    (*SDL20_RenderCopy)(pSVar4,VideoTexture20,(SDL_Rect *)0x0,(SDL_Rect *)0x0);
    renderer = (SDL_Renderer *)QueuedDisplayOverlays.next;
    if (QueuedDisplayOverlays.next != (QueuedOverlayItem *)0x0) {
      while (p_Var3 = SDL20_RenderCopy, renderer != (SDL_Renderer *)0x0) {
        pSVar1 = *(SDL_Renderer **)(renderer + 0x10);
        if (*(long *)renderer != 0) {
          dstrect20._8_8_ = *(undefined8 *)(*(long *)renderer + 0x28);
          pSVar2 = *(SDL_Texture **)dstrect20._8_8_;
          pSVar5 = Rect12to20((SDL12_Rect *)(renderer + 8),(SDL_Rect *)local_38);
          (*p_Var3)(pSVar4,pSVar2,(SDL_Rect *)0x0,pSVar5);
        }
        SDL_free(renderer);
        renderer = pSVar1;
      }
      QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
      QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }
    (*SDL20_RenderPresent)(pSVar4);
    VideoSurfaceUpdatedInBackgroundThread = SDL_FALSE;
    VideoSurfaceLastPresentTicks = (*SDL20_GetTicks)();
    VideoSurfacePresentTicks = 0;
    UnlockVideoRenderer();
  }
  return;
}

Assistant:

static void
PresentScreen(void)
{
    QueuedOverlayItem *overlay;
    SDL_Renderer *renderer = LockVideoRenderer();

    if (!renderer) {
        return;
    }

    /* We don't actually implement an event thread in sdl12-compat, but some
     * games will only call SDL_PeepEvents(), which doesn't otherwise pump
     * events, and get stuck when they've consumed all the events.
     *
     * Just pumping the event loop here simulates an event thread well enough
     * for most things.
     */
    if (EventThreadEnabled) {
        SDL_PumpEvents();
    }

    SDL20_RenderClear(renderer);
    SDL20_RenderCopy(renderer, VideoTexture20, NULL, NULL);

    /* Render any pending YUV overlay over the surface texture. */
    overlay = QueuedDisplayOverlays.next;
    if (overlay) {
        while (overlay != NULL) {
            QueuedOverlayItem *next = overlay->next;
            if (overlay->overlay12) {
                SDL12_YUVData *hwdata = (SDL12_YUVData *) overlay->overlay12->hwdata;
                SDL_Rect dstrect20;
                SDL20_RenderCopy(renderer, hwdata->texture20, NULL, Rect12to20(&overlay->dstrect12, &dstrect20));
            }
            SDL_free(overlay);
            overlay = next;
        }
        QueuedDisplayOverlays.next = NULL;
        QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }

    SDL20_RenderPresent(renderer);
    VideoSurfaceUpdatedInBackgroundThread = SDL_FALSE;
    VideoSurfaceLastPresentTicks = SDL20_GetTicks();
    VideoSurfacePresentTicks = 0;

    UnlockVideoRenderer();
}